

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_unlock_extension.h
# Opt level: O1

void __thiscall dlib::auto_unlock::~auto_unlock(auto_unlock *this)

{
  if ((pthread_mutex_t *)this->m != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)this->m);
    return;
  }
  if (this->r == (rmutex *)0x0) {
    read_write_mutex::unlock(this->rw);
  }
  else {
    rmutex::unlock(this->r,1);
  }
  return;
}

Assistant:

~auto_unlock (
        )
        {
            if (m != 0)
                m->unlock();
            else if (r != 0)
                r->unlock();
            else
                rw->unlock();
        }